

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::preprocessingStringAfterQuote(CScanner *this,char c)

{
  byte bVar1;
  char c_local;
  CScanner *this_local;
  
  if (c == '\'') {
    std::__cxx11::string::push_back((char)this + -0x50);
    this->preprocessingState = PS_String;
  }
  else {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!token.word.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                    ,0x1a1,"void Refal2::CScanner::preprocessingStringAfterQuote(char)");
    }
    addToken(this,TT_String);
    this->preprocessingState = PS_Initial;
    preprocessing(this,c);
  }
  return;
}

Assistant:

void CScanner::preprocessingStringAfterQuote( char c )
{
	if( c == Quote ) {
		token.word.push_back( Quote );
		preprocessingState = PS_String;
	} else {
		assert( !token.word.empty() );
		addToken( TT_String );
		preprocessingState = PS_Initial;
		preprocessing( c );
	}
}